

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O2

void __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::~SparseMatrix
          (SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *this)

{
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->m_outerStarts).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->m_innerIndices).super__Vector_base<int,_std::allocator<int>_>);
  VectorDynSize::~VectorDynSize(&this->m_values);
  return;
}

Assistant:

SparseMatrix<ordering>::~SparseMatrix() {}